

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_swap(Forth *this)

{
  ForthStack<double> *this_00;
  double Value;
  
  requireFStackDepth(this,2,"SWAP");
  this_00 = &this->fStack;
  Value = ForthStack<double>::getTop(this_00,1);
  ForthStack<double>::moveStack(this_00,1,0,1);
  ForthStack<double>::setTop(this_00,Value);
  return;
}

Assistant:

void f_swap() {
			REQUIRE_FSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}